

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O3

void sigpipe_apply(Curl_easy *data,sigpipe_ignore *ig)

{
  ulong uVar1;
  byte bVar2;
  _union_1457 local_a8 [19];
  
  uVar1 = *(ulong *)&(data->set).field_0x8ca;
  bVar2 = (byte)(uVar1 >> 0x18);
  if (((uint)(uVar1 >> 0x1f) & 1) != (uint)ig->no_signal) {
    if (ig->no_signal == false) {
      sigaction(0xd,(sigaction *)ig,(sigaction *)0x0);
      bVar2 = (byte)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x18);
    }
    ig->no_signal = (_Bool)(bVar2 >> 7);
    if (((data->set).field_0x8cd & 0x80) == 0) {
      sigaction(0xd,(sigaction *)0x0,(sigaction *)ig);
      memcpy(local_a8,ig,0x98);
      local_a8[0] = (_union_1457)0x1;
      sigaction(0xd,(sigaction *)local_a8,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

static void sigpipe_apply(struct Curl_easy *data,
                          struct sigpipe_ignore *ig)
{
  if(data->set.no_signal != ig->no_signal) {
    sigpipe_restore(ig);
    sigpipe_ignore(data, ig);
  }
}